

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O0

Array2D<Color> * __thiscall
TilingWFC<Color>::id_to_tiling(TilingWFC<Color> *this,Array2D<unsigned_int> *ids)

{
  uint uVar1;
  value_type vVar2;
  uchar uVar3;
  reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  reference pvVar7;
  Color *pCVar8;
  Array2D<Color> *in_RDX;
  vector<Tile<Color>,_std::allocator<Tile<Color>_>_> *in_RSI;
  Array2D<Color> *in_RDI;
  uint x;
  uint y;
  pair<unsigned_int,_unsigned_int> oriented_tile;
  uint j;
  uint i;
  uint size;
  Array2D<Color> *tiling;
  Color *in_stack_ffffffffffffff98;
  Array2D<Color> *pAVar9;
  uint local_38;
  uint local_34;
  uint local_28;
  uint local_24;
  
  pAVar9 = in_RDI;
  pvVar4 = std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::operator[](in_RSI,0);
  pvVar5 = std::vector<Array2D<Color>,_std::allocator<Array2D<Color>_>_>::operator[]
                     (&pvVar4->data,0);
  uVar1 = pvVar5->height;
  Array2D<Color>::Array2D(in_RDX,(uint)((ulong)pAVar9 >> 0x20),(uint)pAVar9);
  for (local_24 = 0; local_24 < in_RDX->height; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_RDX->width; local_28 = local_28 + 1) {
      pAVar9 = (Array2D<Color> *)(in_RSI + 1);
      puVar6 = Array2D<unsigned_int>::get
                         ((Array2D<unsigned_int> *)pAVar9,
                          (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                          (uint)in_stack_ffffffffffffff98);
      pvVar7 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)pAVar9,(ulong)*puVar6);
      vVar2 = *pvVar7;
      for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
          pvVar4 = std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::operator[]
                             (in_RSI,(ulong)vVar2 & 0xffffffff);
          std::vector<Array2D<Color>,_std::allocator<Array2D<Color>_>_>::operator[]
                    (&pvVar4->data,(ulong)vVar2 >> 0x20);
          in_stack_ffffffffffffff98 =
               Array2D<Color>::get(pAVar9,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                   (uint)in_stack_ffffffffffffff98);
          pCVar8 = Array2D<Color>::get(pAVar9,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                       (uint)in_stack_ffffffffffffff98);
          uVar3 = in_stack_ffffffffffffff98->g;
          pCVar8->r = in_stack_ffffffffffffff98->r;
          pCVar8->g = uVar3;
          pCVar8->b = in_stack_ffffffffffffff98->b;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Array2D<T> id_to_tiling(Array2D<unsigned> ids) {
		unsigned size = tiles[0].data[0].height;
		Array2D<T> tiling(size * ids.height, size * ids.width);
		for (unsigned i = 0; i < ids.height; i++) {
			for (unsigned j = 0; j < ids.width; j++) {
				std::pair<unsigned, unsigned> oriented_tile =
					id_to_oriented_tile[ids.get(i, j)];
				for (unsigned y = 0; y < size; y++) {
					for (unsigned x = 0; x < size; x++) {
						tiling.get(i * size + y, j * size + x) =
							tiles[oriented_tile.first].data[oriented_tile.second].get(y, x);
					}
				}
			}
		}
		return tiling;
	}